

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O1

void __thiscall CVmTimeZone::CVmTimeZone(CVmTimeZone *this,os_tzinfo_t *desc)

{
  char *prefix;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t __n;
  char buf2 [128];
  char buf [128];
  char buf1 [128];
  char acStack_1a8 [128];
  char local_128 [128];
  char local_a8 [136];
  
  this->hashentry_ = (ZoneHashEntry *)0x0;
  pcVar2 = desc->std_abbr;
  if (((desc->std_abbr[0] == '\0') || (desc->dst_abbr[0] == '\0')) ||
     (desc->std_ofs == desc->dst_ofs)) {
    if (desc->is_dst == 0) {
      iVar1 = desc->std_ofs;
    }
    else {
      pcVar2 = desc->dst_abbr;
      iVar1 = desc->dst_ofs;
    }
    gen_ofs_string(local_128,0x80,pcVar2,-iVar1,0);
  }
  else {
    prefix = desc->dst_abbr;
    gen_ofs_string(local_a8,0x80,pcVar2,-desc->std_ofs,0);
    if (desc->dst_ofs == desc->std_ofs + 0xe10) {
      sVar3 = strlen(prefix);
      __n = 0x7f;
      if (sVar3 < 0x7f) {
        __n = sVar3;
      }
      memcpy(acStack_1a8,prefix,__n);
      acStack_1a8[__n] = '\0';
    }
    else {
      gen_ofs_string(acStack_1a8,0x80,prefix,-desc->dst_ofs,0);
    }
    t3sprintf(local_128,0x80,"%s%s",local_a8,acStack_1a8);
  }
  pcVar2 = lib_copy_str(local_128);
  this->name_ = pcVar2;
  init(this,(EVP_PKEY_CTX *)desc);
  return;
}

Assistant:

CVmTimeZone::CVmTimeZone(const os_tzinfo_t *desc)
{
    /* no hash entry */
    hashentry_ = 0;

    /* 
     *   Synthesize a POSIX-style name from the abbreviation and offset.  If
     *   we have both standard and daylight abbreviations and distinct
     *   offsets, generate a POSIX-style "EST5DST" string.  Otherwise just
     *   use the active abbreviation and offset.
     *   
     *   Note that the offset in POSIX strings uses the opposite sign from
     *   what we use - EST is +5 in POSIX strings vs -5 in the zoneinfo
     *   scheme (which is what we use).
     */
    char buf[128];
    if (desc->std_abbr[0] != 0 && desc->dst_abbr[0] != 0
        && desc->std_ofs != desc->dst_ofs)
    {
        /* 
         *   Use both abbreviations, as in EST5DST.  If the daylight offset
         *   is one hour higher than the standard offset, omit the offset
         *   from the daylight part, since that's the default; otherwise
         *   include it.
         */
        char buf1[128], buf2[128];
        gen_ofs_string(buf1, sizeof(buf1), desc->std_abbr, -desc->std_ofs, 0);
        if (desc->dst_ofs == desc->std_ofs + 3600)
            lib_strcpy(buf2, sizeof(buf2), desc->dst_abbr);
        else
            gen_ofs_string(buf2, sizeof(buf2),
                           desc->dst_abbr, -desc->dst_ofs, 0);

        /* build the combined string */
        t3sprintf(buf, sizeof(buf), "%s%s", buf1, buf2);
    }
    else if (desc->is_dst)
    {
        /* use the daylight abbreviation only */
        gen_ofs_string(buf, sizeof(buf), desc->dst_abbr, -desc->dst_ofs, 0);
    }
    else
    {
        /* use the standard time abbreviation only */
        gen_ofs_string(buf, sizeof(buf), desc->std_abbr, -desc->std_ofs, 0);
    }

    /* save the name */
    name_ = lib_copy_str(buf);

    /* initialize from the descriptor */
    init(desc);
}